

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void AddVectorEq_SSE2(uint32_t *a,uint32_t *out,int size)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  uint32_t uVar32;
  uint32_t uVar33;
  uint uVar34;
  ulong uVar36;
  ulong uVar37;
  ulong uVar35;
  
  uVar34 = size & 0xfffffff0;
  uVar35 = (ulong)uVar34;
  uVar37 = 0;
  do {
    uVar36 = uVar37;
    puVar1 = a + uVar36;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = a + uVar36 + 4;
    uVar7 = *puVar2;
    uVar8 = puVar2[1];
    uVar9 = puVar2[2];
    uVar10 = puVar2[3];
    puVar2 = a + uVar36 + 8;
    uVar11 = *puVar2;
    uVar12 = puVar2[1];
    uVar13 = puVar2[2];
    uVar14 = puVar2[3];
    puVar2 = a + uVar36 + 0xc;
    uVar15 = *puVar2;
    uVar16 = puVar2[1];
    uVar17 = puVar2[2];
    uVar18 = puVar2[3];
    puVar2 = out + uVar36;
    uVar19 = puVar2[1];
    uVar20 = puVar2[2];
    uVar21 = puVar2[3];
    puVar3 = out + uVar36 + 4;
    uVar22 = *puVar3;
    uVar23 = puVar3[1];
    uVar24 = puVar3[2];
    uVar25 = puVar3[3];
    puVar3 = out + uVar36 + 8;
    uVar26 = *puVar3;
    uVar27 = puVar3[1];
    uVar28 = puVar3[2];
    uVar29 = puVar3[3];
    puVar3 = out + uVar36 + 0xc;
    uVar30 = *puVar3;
    uVar31 = puVar3[1];
    uVar32 = puVar3[2];
    uVar33 = puVar3[3];
    puVar3 = out + uVar36;
    *puVar3 = *puVar2 + *puVar1;
    puVar3[1] = uVar19 + uVar4;
    puVar3[2] = uVar20 + uVar5;
    puVar3[3] = uVar21 + uVar6;
    puVar1 = out + uVar36 + 4;
    *puVar1 = uVar22 + uVar7;
    puVar1[1] = uVar23 + uVar8;
    puVar1[2] = uVar24 + uVar9;
    puVar1[3] = uVar25 + uVar10;
    puVar1 = out + uVar36 + 8;
    *puVar1 = uVar26 + uVar11;
    puVar1[1] = uVar27 + uVar12;
    puVar1[2] = uVar28 + uVar13;
    puVar1[3] = uVar29 + uVar14;
    puVar1 = out + uVar36 + 0xc;
    *puVar1 = uVar30 + uVar15;
    puVar1[1] = uVar31 + uVar16;
    puVar1[2] = uVar32 + uVar17;
    puVar1[3] = uVar33 + uVar18;
    uVar37 = uVar36 + 0x10;
  } while (uVar35 != uVar37);
  if ((size & 8U) != 0) {
    puVar1 = a + uVar35;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    uVar34 = (int)uVar36 + 0x14U & 0xfffffff4;
    puVar2 = a + uVar34;
    uVar7 = *puVar2;
    uVar8 = puVar2[1];
    uVar9 = puVar2[2];
    uVar10 = puVar2[3];
    puVar2 = out + uVar35;
    uVar11 = puVar2[1];
    uVar12 = puVar2[2];
    uVar13 = puVar2[3];
    puVar3 = out + uVar34;
    uVar14 = *puVar3;
    uVar15 = puVar3[1];
    uVar16 = puVar3[2];
    uVar17 = puVar3[3];
    puVar3 = out + uVar35;
    *puVar3 = *puVar2 + *puVar1;
    puVar3[1] = uVar11 + uVar4;
    puVar3[2] = uVar12 + uVar5;
    puVar3[3] = uVar13 + uVar6;
    puVar1 = out + uVar34;
    *puVar1 = uVar14 + uVar7;
    puVar1[1] = uVar15 + uVar8;
    puVar1[2] = uVar16 + uVar9;
    puVar1[3] = uVar17 + uVar10;
    uVar34 = (int)uVar37 + 8;
  }
  if ((size & 7U) == 2) {
    *(ulong *)(out + (int)uVar34) =
         CONCAT44((int)((ulong)*(undefined8 *)(out + (int)uVar34) >> 0x20) +
                  (int)((ulong)*(undefined8 *)(a + (int)uVar34) >> 0x20),
                  (int)*(undefined8 *)(out + (int)uVar34) + (int)*(undefined8 *)(a + (int)uVar34));
  }
  else if ((size & 7U) == 4) {
    puVar1 = a + (int)uVar34;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = out + (int)uVar34;
    uVar7 = puVar2[1];
    uVar8 = puVar2[2];
    uVar9 = puVar2[3];
    puVar3 = out + (int)uVar34;
    *puVar3 = *puVar2 + *puVar1;
    puVar3[1] = uVar7 + uVar4;
    puVar3[2] = uVar8 + uVar5;
    puVar3[3] = uVar9 + uVar6;
    return;
  }
  return;
}

Assistant:

static void AddVectorEq_SSE2(const uint32_t* WEBP_RESTRICT a,
                             uint32_t* WEBP_RESTRICT out, int size) {
  int i = 0;
  int aligned_size = size & ~15;
  // Size is, at minimum, NUM_DISTANCE_CODES (40) and may be as large as
  // NUM_LITERAL_CODES (256) + NUM_LENGTH_CODES (24) + (0 or a non-zero power of
  // 2). See the usage in VP8LHistogramAdd().
  assert(size >= 16);
  assert(size % 2 == 0);

  do {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i +  0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[i +  4]);
    const __m128i a2 = _mm_loadu_si128((const __m128i*)&a[i +  8]);
    const __m128i a3 = _mm_loadu_si128((const __m128i*)&a[i + 12]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i +  0]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&out[i +  4]);
    const __m128i b2 = _mm_loadu_si128((const __m128i*)&out[i +  8]);
    const __m128i b3 = _mm_loadu_si128((const __m128i*)&out[i + 12]);
    _mm_storeu_si128((__m128i*)&out[i +  0], _mm_add_epi32(a0, b0));
    _mm_storeu_si128((__m128i*)&out[i +  4], _mm_add_epi32(a1, b1));
    _mm_storeu_si128((__m128i*)&out[i +  8], _mm_add_epi32(a2, b2));
    _mm_storeu_si128((__m128i*)&out[i + 12], _mm_add_epi32(a3, b3));
    i += 16;
  } while (i != aligned_size);

  if ((size & 8) != 0) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i + 0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[i + 4]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i + 0]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&out[i + 4]);
    _mm_storeu_si128((__m128i*)&out[i + 0], _mm_add_epi32(a0, b0));
    _mm_storeu_si128((__m128i*)&out[i + 4], _mm_add_epi32(a1, b1));
    i += 8;
  }

  size &= 7;
  if (size == 4) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[i]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&out[i]);
    _mm_storeu_si128((__m128i*)&out[i], _mm_add_epi32(a0, b0));
  } else if (size == 2) {
    const __m128i a0 = _mm_loadl_epi64((const __m128i*)&a[i]);
    const __m128i b0 = _mm_loadl_epi64((const __m128i*)&out[i]);
    _mm_storel_epi64((__m128i*)&out[i], _mm_add_epi32(a0, b0));
  }
}